

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsstm.cpp
# Opt level: O3

CTPNStm * __thiscall CTcParser::parse_local(CTcParser *this,int *err)

{
  int iVar1;
  size_t len;
  char *pcVar2;
  bool bVar3;
  CTcTokenizer *pCVar4;
  CTcTokFileDesc *pCVar5;
  tc_toktyp_t tVar6;
  CTcSymLocal *lcl;
  CTcPrsNode *pCVar7;
  CTcTokFileDesc *pCVar8;
  int *err_00;
  CTcSymLocal *sym;
  CTcTokFileDesc *pCVar9;
  CTcTokFileDesc *local_40;
  
  CTcTokenizer::next(G_tok);
  local_40 = (CTcTokFileDesc *)0x0;
  pCVar9 = (CTcTokFileDesc *)0x0;
  do {
    if ((G_tok->curtok_).typ_ == TOKT_SYM) {
      sym = (CTcSymLocal *)(G_tok->curtok_).text_;
      len = (G_tok->curtok_).text_len_;
      iVar1 = this->local_cnt_;
      if (this->max_local_cnt_ <= iVar1) {
        this->max_local_cnt_ = iVar1 + 1;
      }
      this->local_cnt_ = iVar1 + 1;
      bVar3 = false;
      lcl = CTcPrsSymtab::add_local(this->local_symtab_,(textchar_t *)sym,len,iVar1,0,0,0);
      tVar6 = CTcTokenizer::next(G_tok);
      pCVar8 = pCVar9;
      pCVar5 = local_40;
      if ((tVar6 == TOKT_ASI) || (tVar6 == TOKT_EQ)) {
        pCVar7 = parse_local_initializer(this,lcl,err_00);
        if (pCVar7 == (CTcPrsNode *)0x0) {
          bVar3 = true;
          sym = lcl;
        }
        else {
          pCVar8 = (CTcTokFileDesc *)
                   CTcPrsAllocObj::operator_new((CTcPrsAllocObj *)0x28,(size_t)lcl);
          CTPNStmBase::CTPNStmBase((CTPNStmBase *)pCVar8);
          ((CTPNStmBase *)&pCVar8->squoted_fname_)->super_CTcPrsNode = (CTcPrsNode)pCVar7;
          (((CTcPrsNode *)&pCVar8->index_)->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase =
               (_func_int **)&PTR_gen_code_00313c18;
          pcVar2 = (char *)G_tok->last_linenum_;
          pCVar8->orig_fname_ = (char *)G_tok->last_desc_;
          pCVar8->dquoted_fname_ = pcVar2;
          sym = lcl;
          pCVar5 = pCVar8;
          if (pCVar9 != (CTcTokFileDesc *)0x0) {
            pCVar9->fname_ = (char *)pCVar8;
            pCVar5 = local_40;
          }
        }
      }
      local_40 = pCVar5;
      tVar6 = (G_tok->curtok_).typ_;
      pCVar9 = pCVar8;
      if (tVar6 == TOKT_SYM) {
        sym = (CTcSymLocal *)0x2b28;
        CTcTokenizer::log_error_curtok(G_tok,0x2b28);
      }
      else {
        if (tVar6 != TOKT_COMMA) {
          if (tVar6 == TOKT_SEM) {
LAB_00201ef7:
            CTcTokenizer::next(G_tok);
          }
          else {
            sym = (CTcSymLocal *)0x2b28;
            CTcTokenizer::log_error_curtok(G_tok,0x2b28);
          }
          break;
        }
        CTcTokenizer::next(G_tok);
      }
    }
    else {
      sym = (CTcSymLocal *)0x2b29;
      CTcTokenizer::log_error_curtok(G_tok,0x2b29);
      tVar6 = (G_tok->curtok_).typ_;
      if (tVar6 != TOKT_COMMA) {
        if (tVar6 == TOKT_EOF) {
          *err = 1;
          break;
        }
        if (tVar6 == TOKT_SEM) goto LAB_00201ef7;
      }
      CTcTokenizer::next(G_tok);
      bVar3 = false;
    }
  } while (!bVar3);
  if (local_40 == (CTcTokFileDesc *)0x0) {
    local_40 = (CTcTokFileDesc *)0x0;
  }
  else if (local_40 != pCVar9) {
    pCVar8 = (CTcTokFileDesc *)CTcPrsAllocObj::operator_new((CTcPrsAllocObj *)0x48,(size_t)sym);
    pCVar9 = (CTcTokFileDesc *)this->local_symtab_;
    CTPNStmBase::CTPNStmBase((CTPNStmBase *)pCVar8);
    (((CTcPrsNode *)&pCVar8->index_)->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase =
         (_func_int **)&PTR_gen_code_00311f18;
    ((CTPNStmBase *)&pCVar8->dquoted_rootname_)->super_CTcPrsNode = (CTcPrsNode)local_40;
    pCVar8->next_ = pCVar9;
    *(byte *)&pCVar8->orig_ = *(byte *)&pCVar8->orig_ & 0xfe;
    pCVar4 = G_tok;
    pCVar8->squoted_fname_ = (char *)G_tok->last_desc_;
    pCVar8->squoted_rootname_ = (char *)pCVar4->last_linenum_;
    (((CTcPrsNode *)&pCVar8->index_)->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase =
         (_func_int **)&PTR_gen_code_00313d38;
    local_40 = pCVar8;
  }
  return (CTPNStm *)local_40;
}

Assistant:

CTPNStm *CTcParser::parse_local(int *err)
{
    int done;
    CTPNStm *first_stm;
    CTPNStm *last_stm;

    /* we have no initializer statements yet */
    first_stm = last_stm = 0;

    /* skip the 'local' keyword */
    G_tok->next();

    /* keep going until we reach the closing semicolon */
    for (done = FALSE ; !done ; )
    {
        /* we need a symbol name */
        if (G_tok->cur() == TOKT_SYM)
        {
            const char *sym;
            size_t symlen;
            CTcSymLocal *lcl;
            CTPNStm *stm;
            CTcPrsNode *expr;
            
            /* get the symbol string from the token */
            sym = G_tok->getcur()->get_text();
            symlen = G_tok->getcur()->get_text_len();
            
            /* add the new local variable to our symbol table */
            lcl = local_symtab_->add_local(sym, symlen, alloc_local(),
                                           FALSE, FALSE, FALSE);

            /* skip the symbol and check for an initial value assignment */
            switch (G_tok->next())
            {
            case TOKT_EQ:
            case TOKT_ASI:
                /* parse the initializer */
                expr = parse_local_initializer(lcl, err);

                /* if we didn't get a statement, we can't proceed */
                if (expr == 0)
                {
                    done = TRUE;
                    break;
                }

                /* create a statement for the assignment */
                stm = new CTPNStmExpr(expr);

                /* 
                 *   set the statement's source location according to the
                 *   current source location - if we have multiple
                 *   initializers over several lines, this will allow the
                 *   debugger to step through the individual
                 *   initializations 
                 */
                stm->set_source_pos(G_tok->get_last_desc(),
                                    G_tok->get_last_linenum());

                /* add the statement to our list */
                if (last_stm != 0)
                    last_stm->set_next_stm(stm);
                else
                    first_stm = stm;
                last_stm = stm;

                /* done */
                break;

            default:
                /* there's nothing more to do with this variable */
                break;
            }

            /* 
             *   check what follows - we can have a comma to introduce
             *   another local variable, or a semicolon to end the
             *   statement 
             */
            switch(G_tok->cur())
            {
            case TOKT_COMMA:
                /* skip the comma and go on to the next variable */
                G_tok->next();
                break;

            case TOKT_SEM:
                /* skip the semicolon, and stop scanning */
                G_tok->next();
                done = TRUE;
                break;

            case TOKT_SYM:
                /* 
                 *   they probably just left out a comma - assume the
                 *   comma is there and keep going 
                 */
                G_tok->log_error_curtok(TCERR_LOCAL_REQ_COMMA);
                break;

            default:
                /* 
                 *   these almost certainly indicate that they left out a
                 *   semicolon - report the error and continue from here 
                 */
                G_tok->log_error_curtok(TCERR_LOCAL_REQ_COMMA);
                done = TRUE;
                break;
            }
        }
        else
        {
            /* symbol required - log the error */
            G_tok->log_error_curtok(TCERR_LOCAL_REQ_SYM);

            /* determine how to proceed based on what we have */
            switch(G_tok->cur())
            {
            case TOKT_COMMA:
                /* 
                 *   they probably just put in an extra comma - skip it
                 *   and keep trying to parse the local list 
                 */
                G_tok->next();
                break;

            case TOKT_SEM:
                /* that's the end of the statement */
                G_tok->next();
                done = TRUE;
                break;

            case TOKT_EOF:
                /* set the error flag and stop scanning */
                *err = TRUE;
                done = TRUE;
                break;

            default:
                /* try skipping this token and trying again */
                G_tok->next();
                break;
            }
        }
    }

    /* 
     *   if we have one statement, return it; if we have more than one,
     *   return a compound statement to contain the list; if we have
     *   nothing, return nothing 
     */
    if (first_stm == 0)
        return 0;
    else if (first_stm == last_stm)
        return first_stm;
    else
        return new CTPNStmComp(first_stm, local_symtab_);
}